

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O3

void ThreadCleanupRoutine
               (CPalThread *pThread,IPalObject *pObjectToCleanup,bool fShutdown,
               bool fCleanupSharedState)

{
  CPalThread *this;
  int iVar1;
  CThreadProcessLocalData *pThreadData;
  IDataLock *pDataLock;
  
  iVar1 = (*pObjectToCleanup->_vptr_IPalObject[3])(pObjectToCleanup,pThread,1);
  this = pCRam0000000000000000;
  if (iVar1 == 0) {
    pCRam0000000000000000 = (CPalThread *)0x0;
    (*(code *)0x0)(0,pThread,1);
    CorUnix::CPalThread::ReleaseThreadReference(this);
  }
  else {
    fprintf(_stderr,"] %s %s:%d","ThreadCleanupRoutine",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x8d2);
    fprintf(_stderr,"Unable to obtain thread data");
  }
  return;
}

Assistant:

void
ThreadCleanupRoutine(
    CPalThread *pThread,
    IPalObject *pObjectToCleanup,
    bool fShutdown,
    bool fCleanupSharedState
    )
{
    CThreadProcessLocalData *pThreadData = NULL;
    CPalThread *pThreadToCleanup = NULL;
    IDataLock *pDataLock = NULL;
    PAL_ERROR palError = NO_ERROR;

    //
    // Free the CPalThread data for the passed in thread
    //

    palError = pObjectToCleanup->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pThreadData)
        );

    if (NO_ERROR == palError)
    {
        //
        // Note that we may be cleaning up the data for the calling
        // thread (i.e., pThread == pThreadToCleanup), so the release
        // of the thread reference needs to be the last thing that
        // we do (though in that case it's very likely that the person
        // calling us will be holding an extra reference to allow
        // for the thread data to be available while the rest of the
        // object cleanup takes place).
        //

        pThreadToCleanup = pThreadData->pThread;
        pThreadData->pThread = NULL;
        pDataLock->ReleaseLock(pThread, TRUE);
        pThreadToCleanup->ReleaseThreadReference();
    }
    else
    {
        ASSERT("Unable to obtain thread data");
    }

}